

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int outch;
  size_t sVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Option *opt_00;
  Mat *pMVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined1 (*pauVar17) [64];
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long local_678;
  ulong local_670;
  undefined1 local_660 [16];
  Mat local_640;
  long local_5f0;
  void *local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  Mat local_5b0;
  Option *local_560;
  Mat *local_558;
  Mat local_550;
  Mat local_500;
  Mat *local_4b0;
  size_t local_4a8;
  Mat *local_4a0;
  long local_498;
  undefined1 local_490 [16];
  undefined1 auStack_480 [64];
  undefined1 auStack_440 [64];
  undefined1 auStack_400 [64];
  undefined1 auStack_3c0 [64];
  undefined1 auStack_380 [256];
  undefined1 auStack_280 [256];
  undefined1 auStack_180 [256];
  undefined1 auStack_80 [80];
  
  iVar14 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  iVar15 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar27._4_4_ = uVar3;
  auVar27._0_4_ = uVar1;
  outch = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_5b0.data = bottom_blob->data;
  local_5b0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_5b0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_5b0.allocator = bottom_blob->allocator;
  auVar7._0_4_ = bottom_blob->dims;
  auVar7._4_4_ = bottom_blob->w;
  auVar7._8_4_ = bottom_blob->h;
  auVar7._12_4_ = bottom_blob->d;
  local_5b0.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  auVar33 = vpcmpeqd_avx(auVar7,auVar7);
  auVar27._8_8_ = 0;
  auVar27 = vpsubd_avx(auVar27,auVar33);
  auVar33 = vpsrld_avx(auVar27,0x1f);
  local_660 = vpaddd_avx(auVar27,auVar33);
  auVar33._8_4_ = 0xfffffffe;
  auVar33._0_8_ = 0xfffffffefffffffe;
  auVar33._12_4_ = 0xfffffffe;
  local_490 = vpandd_avx512vl(local_660,auVar33);
  local_5b8 = local_490._0_4_;
  local_5bc = local_490._4_4_;
  local_5b0.elemsize = sVar5;
  local_5b0.elempack = iVar15;
  local_5b0.dims = auVar7._0_4_;
  local_5b0.w = auVar7._4_4_;
  local_5b0.h = auVar7._8_4_;
  local_5b0.d = auVar7._12_4_;
  local_5b0.c = iVar14;
  local_4b0 = bias;
  local_4a0 = kernel_tm;
  copy_make_border(bottom_blob,&local_5b0,0,(local_5bc - bottom_blob->h) + 2,0,
                   (local_5b8 - bottom_blob->w) + 2,0,0.0,opt);
  auVar27 = vpsrad_avx512vl(local_660,1);
  local_550.cstep = 0;
  auVar7 = vpshufd_avx(auVar27,0x55);
  auVar7 = vpmulld_avx(auVar7,auVar27);
  local_550.data = (void *)0x0;
  local_550.refcount._0_4_ = 0;
  local_550.refcount._4_4_ = 0;
  local_550.elemsize = 0;
  local_550.elempack = 0;
  local_550.allocator = (Allocator *)0x0;
  local_550.dims = 0;
  local_550.w = 0;
  local_550.h = 0;
  local_550.d = 0;
  local_550.c = 0;
  local_5b4 = iVar15;
  local_560 = opt;
  local_558 = top_blob;
  local_4a8 = sVar5;
  Mat::create(&local_550,auVar7._0_4_,0x10,iVar14,sVar5,iVar15,opt->workspace_allocator);
  sVar5 = local_4a8;
  pMVar12 = local_558;
  opt_00 = local_560;
  iVar14 = local_5b4;
  if (0 < (long)local_5b0.c) {
    local_5c8 = (ulong)(uint)local_5b0.w;
    local_5e0 = (ulong)(uint)local_5b0.h;
    uVar20 = (local_5b0.h - ((int)(local_5b0.h - 2U) >> 0x1f)) + -2 >> 1;
    uVar13 = (local_5b0.w - ((int)(local_5b0.w - 2U) >> 0x1f)) + -2 >> 1;
    iVar15 = uVar13 * uVar20;
    uVar25 = 1;
    if (1 < (int)uVar13) {
      uVar25 = (ulong)uVar13;
    }
    if ((int)uVar20 < 2) {
      uVar20 = 1;
    }
    local_5d0 = (ulong)uVar20;
    local_5d8 = (long)(int)uVar13 * 0x40;
    local_5e8 = (void *)((long)(iVar15 * 0x10) * 4);
    local_498 = (long)(iVar15 * 0x30) * 4;
    local_5f0 = (long)(iVar15 * 0x20) * 4;
    local_678 = 0;
    do {
      if (3 < local_5b0.h) {
        local_660._0_8_ =
             (long)local_5b0.data + local_5b0.elemsize * local_5b0.cstep * local_678 + 0xc0;
        lVar23 = local_550.elemsize * local_550.cstep * local_678;
        lVar16 = 0;
        uVar19 = 0;
        do {
          if (3 < local_5b0.w) {
            uVar24 = 0;
            lVar18 = lVar16;
            pauVar17 = (undefined1 (*) [64])local_660._0_8_;
            do {
              lVar22 = -0x100;
              pauVar26 = pauVar17;
              do {
                auVar31 = pauVar26[-2];
                auVar30 = pauVar26[-1];
                auVar28 = vsubps_avx512f(pauVar26[-3],auVar30);
                auVar29 = vaddps_avx512f(auVar30,auVar31);
                auVar30 = vsubps_avx512f(auVar30,auVar31);
                auVar31 = vsubps_avx512f(*pauVar26,auVar31);
                *(undefined1 (*) [64])(auStack_380 + lVar22) = auVar28;
                *(undefined1 (*) [64])(auStack_280 + lVar22) = auVar29;
                *(undefined1 (*) [64])(auStack_180 + lVar22) = auVar30;
                *(undefined1 (*) [64])(auStack_80 + lVar22) = auVar31;
                pauVar26 = (undefined1 (*) [64])(*pauVar26 + (long)(local_5b0.w << 4) * 4);
                lVar22 = lVar22 + 0x40;
              } while (lVar22 != 0);
              lVar21 = 0;
              lVar22 = lVar18;
              do {
                auVar31 = *(undefined1 (*) [64])(auStack_440 + lVar21);
                auVar30 = *(undefined1 (*) [64])(auStack_400 + lVar21);
                auVar28 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_480 + lVar21),auVar30);
                auVar29 = vaddps_avx512f(auVar30,auVar31);
                auVar30 = vsubps_avx512f(auVar30,auVar31);
                auVar31 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_3c0 + lVar21),auVar31);
                *(undefined1 (*) [64])((long)local_550.data + lVar22 + lVar23) = auVar28;
                *(undefined1 (*) [64])((long)local_550.data + (long)local_5e8 + lVar22 + lVar23) =
                     auVar29;
                *(undefined1 (*) [64])((long)local_550.data + lVar22 + local_5f0 + lVar23) = auVar30
                ;
                *(undefined1 (*) [64])((long)local_550.data + lVar22 + local_498 + lVar23) = auVar31
                ;
                lVar21 = lVar21 + 0x100;
                lVar22 = lVar22 + (long)(iVar15 * 0x40) * 4;
              } while (lVar21 != 0x400);
              uVar24 = uVar24 + 1;
              pauVar17 = pauVar17 + 2;
              lVar18 = lVar18 + 0x40;
            } while (uVar24 != uVar25);
          }
          uVar19 = uVar19 + 1;
          local_660._0_8_ =
               (undefined1 *)local_660._0_8_ + (long)local_5b0.w * local_5b0.elemsize * 2;
          lVar16 = lVar16 + local_5d8;
        } while (uVar19 != local_5d0);
      }
      local_678 = local_678 + 1;
    } while (local_678 != local_5b0.c);
  }
  piVar6 = (int *)CONCAT44(local_5b0.refcount._4_4_,local_5b0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_5b0.allocator == (Allocator *)0x0) {
        if (local_5b0.data != (void *)0x0) {
          free(local_5b0.data);
        }
      }
      else {
        (*(local_5b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_5b0.cstep = 0;
  local_5b0.data = (void *)0x0;
  local_5b0.refcount._0_4_ = 0;
  local_5b0.refcount._4_4_ = 0;
  local_5b0.elemsize = 0;
  local_5b0.elempack = 0;
  local_5b0.h = 0;
  local_5b0.d = 0;
  local_5b0.c = 0;
  local_5b0.allocator = (Allocator *)0x0;
  local_5b0.dims = 0;
  local_5b0.w = 0;
  local_500.cstep = 0;
  local_500.data = (void *)0x0;
  local_500.refcount._0_4_ = 0;
  local_500.refcount._4_4_ = 0;
  local_500.elemsize = 0;
  local_500.elempack = 0;
  local_500.allocator = (Allocator *)0x0;
  local_500.dims = 0;
  local_500.w = 0;
  local_500.h = 0;
  local_500.d = 0;
  local_500.c = 0;
  convolution_winograd_dot_pack16_avx512(&local_550,outch,local_4a0,&local_500,opt_00);
  local_640.cstep = 0;
  local_640.data = (void *)0x0;
  local_640.refcount._0_4_ = 0;
  local_640.refcount._4_4_ = 0;
  local_640.elemsize = 0;
  local_640.elempack = 0;
  local_640.allocator = (Allocator *)0x0;
  local_640.dims = 0;
  local_640.w = 0;
  local_640.h = 0;
  local_640.d = 0;
  local_640.c = 0;
  uVar2 = pMVar12->w;
  uVar4 = pMVar12->h;
  auVar32._4_4_ = uVar4;
  auVar32._0_4_ = uVar2;
  auVar32._8_8_ = 0;
  uVar25 = vpcmpd_avx512vl(auVar32,local_490,4);
  if ((uVar25 & 3) == 0) {
    if (&local_640 != pMVar12) {
      piVar6 = pMVar12->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_640.data = pMVar12->data;
      local_640.refcount._0_4_ = SUB84(pMVar12->refcount,0);
      local_640.refcount._4_4_ = (undefined4)((ulong)pMVar12->refcount >> 0x20);
      local_640.elemsize = pMVar12->elemsize;
      local_640.elempack = pMVar12->elempack;
      local_640.allocator = pMVar12->allocator;
      uVar8 = pMVar12->dims;
      uVar9 = pMVar12->w;
      uVar10 = pMVar12->h;
      uVar11 = pMVar12->d;
      local_640.c = pMVar12->c;
      local_640.cstep = pMVar12->cstep;
      local_640.dims = uVar8;
      local_640.w = uVar9;
      local_640.h = uVar10;
      local_640.d = uVar11;
    }
  }
  else {
    Mat::create(&local_640,local_5b8,local_5bc,outch,sVar5,iVar14,opt_00->workspace_allocator);
  }
  local_5e0 = (ulong)local_640.c;
  if (0 < (long)local_5e0) {
    local_5e8 = local_4b0->data;
    local_5f0 = CONCAT44(local_5f0._4_4_,local_640.h);
    local_5d8 = (ulong)(uint)(local_640.h / 2);
    uVar20 = local_640.w / 2;
    iVar14 = uVar20 * (local_640.h / 2);
    local_5d0 = CONCAT44(local_5d0._4_4_,local_640.w);
    lVar16 = 0;
    do {
      if (local_5e8 == (void *)0x0) {
        auVar31 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_5e8 + lVar16 * 0x40));
      }
      if (1 < local_640.h) {
        local_5c8 = (long)local_640.w * local_640.elemsize * 2;
        local_660._0_8_ =
             (long)local_640.data + local_640.elemsize * local_640.cstep * lVar16 + 0x40;
        local_670 = 0;
        uVar25 = 0;
        do {
          if (1 < local_640.w) {
            uVar24 = 0;
            pauVar17 = (undefined1 (*) [64])local_660._0_8_;
            uVar19 = local_670;
            do {
              pauVar26 = (undefined1 (*) [64])
                         ((long)local_500.data +
                         (uVar19 >> 4 & 0xfffffff) * 0x40 +
                         local_500.elemsize * local_500.cstep * lVar16);
              lVar23 = -0x100;
              do {
                auVar30 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar26 + (long)(iVar14 * 0x10) * 4),*pauVar26);
                auVar30 = vaddps_avx512f(auVar30,*(undefined1 (*) [64])
                                                  (*pauVar26 + (long)(iVar14 * 0x20) * 4));
                auVar28 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar26 + (long)(iVar14 * 0x10) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar26 + (long)(iVar14 * 0x20) * 4));
                auVar28 = vaddps_avx512f(auVar28,*(undefined1 (*) [64])
                                                  (*pauVar26 + (long)(iVar14 * 0x30) * 4));
                *(undefined1 (*) [64])(auStack_380 + lVar23) = auVar30;
                *(undefined1 (*) [64])(auStack_280 + lVar23) = auVar28;
                pauVar26 = (undefined1 (*) [64])(*pauVar26 + (long)(iVar14 * 0x40) * 4);
                lVar23 = lVar23 + 0x40;
              } while (lVar23 != 0);
              lVar23 = 0;
              pauVar26 = pauVar17;
              do {
                auVar30 = vaddps_avx512f(auVar31,*(undefined1 (*) [64])(auStack_440 + lVar23));
                auVar28 = vaddps_avx512f(auVar30,*(undefined1 (*) [64])(auStack_480 + lVar23));
                auVar28 = vaddps_avx512f(auVar28,*(undefined1 (*) [64])(auStack_400 + lVar23));
                auVar30 = vsubps_avx512f(auVar30,*(undefined1 (*) [64])(auStack_400 + lVar23));
                auVar30 = vaddps_avx512f(auVar30,*(undefined1 (*) [64])(auStack_3c0 + lVar23));
                pauVar26[-1] = auVar28;
                *pauVar26 = auVar30;
                lVar23 = lVar23 + 0x100;
                pauVar26 = (undefined1 (*) [64])(*pauVar26 + (long)(local_640.w << 4) * 4);
              } while (lVar23 == 0x100);
              uVar24 = uVar24 + 1;
              uVar19 = uVar19 + 0x10;
              pauVar17 = pauVar17 + 2;
            } while (uVar24 != uVar20);
          }
          uVar25 = uVar25 + 1;
          local_670 = local_670 + (ulong)uVar20 * 0x10;
          local_660._0_8_ = (undefined1 *)local_660._0_8_ + local_5c8;
        } while (uVar25 != local_5d8);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_5e0);
  }
  copy_cut_border(&local_640,local_558,0,local_640.h - local_558->h,0,local_640.w - local_558->w,
                  local_560);
  piVar6 = (int *)CONCAT44(local_640.refcount._4_4_,local_640.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_640.allocator == (Allocator *)0x0) {
        if (local_640.data != (void *)0x0) {
          free(local_640.data);
        }
      }
      else {
        (*(local_640.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_640.cstep = 0;
  local_640.data = (void *)0x0;
  local_640.refcount._0_4_ = 0;
  local_640.refcount._4_4_ = 0;
  local_640.elemsize = 0;
  local_640.elempack = 0;
  local_640.dims = 0;
  local_640.w = 0;
  local_640.h = 0;
  local_640.d = 0;
  local_640.c = 0;
  piVar6 = (int *)CONCAT44(local_500.refcount._4_4_,local_500.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_500.allocator == (Allocator *)0x0) {
        if (local_500.data != (void *)0x0) {
          free(local_500.data);
        }
      }
      else {
        (*(local_500.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_500.cstep = 0;
  local_500.data = (void *)0x0;
  local_500.refcount._0_4_ = 0;
  local_500.refcount._4_4_ = 0;
  local_500.elemsize = 0;
  local_500.elempack = 0;
  local_500.dims = 0;
  local_500.w = 0;
  local_500.h = 0;
  local_500.d = 0;
  local_500.c = 0;
  piVar6 = (int *)CONCAT44(local_550.refcount._4_4_,local_550.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_550.allocator == (Allocator *)0x0) {
        if (local_550.data != (void *)0x0) {
          free(local_550.data);
        }
      }
      else {
        (*(local_550.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_550.cstep = 0;
  local_550.data = (void *)0x0;
  local_550.refcount._0_4_ = 0;
  local_550.refcount._4_4_ = 0;
  local_550.elemsize = 0;
  local_550.elempack = 0;
  local_550.dims = 0;
  local_550.w = 0;
  local_550.h = 0;
  local_550.d = 0;
  local_550.c = 0;
  piVar6 = (int *)CONCAT44(local_5b0.refcount._4_4_,local_5b0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_5b0.allocator == (Allocator *)0x0) {
        if (local_5b0.data != (void *)0x0) {
          free(local_5b0.data);
        }
      }
      else {
        (*(local_5b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}